

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O0

word Dau_Dsd6ToTruth(char *p)

{
  int *pMatches;
  word local_18;
  word Res;
  char *p_local;
  
  Res = (word)p;
  if ((*p == '0') && (p[1] == '\0')) {
    local_18 = 0;
  }
  else if ((*p == '1') && (p[1] == '\0')) {
    local_18 = 0xffffffffffffffff;
  }
  else {
    pMatches = Dau_DsdComputeMatches(p);
    local_18 = Dau_Dsd6ToTruth_rec(p,(char **)&Res,pMatches,s_Truths6);
  }
  if (*(char *)(Res + 1) != '\0') {
    Res = Res + 1;
    __assert_fail("*++p == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                  ,0x1c6,"word Dau_Dsd6ToTruth(char *)");
  }
  return local_18;
}

Assistant:

word Dau_Dsd6ToTruth( char * p )
{
    word Res;
    if ( *p == '0' && *(p+1) == 0 )
        Res = 0;
    else if ( *p == '1' && *(p+1) == 0 )
        Res = ~(word)0;
    else
        Res = Dau_Dsd6ToTruth_rec( p, &p, Dau_DsdComputeMatches(p), s_Truths6 );
    assert( *++p == 0 );
    return Res;
}